

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# session.cpp
# Opt level: O0

char * cppcms_capi_session_get_binary_as_hex(cppcms_capi_session *session,char *key)

{
  byte bVar1;
  char *pcVar2;
  bool bVar3;
  int iVar4;
  string *psVar5;
  byte *pbVar6;
  char *in_RSI;
  long in_RDI;
  uchar c;
  int i;
  int len;
  string tmp;
  string *value;
  string *in_stack_ffffffffffffff08;
  string *this;
  session_interface *in_stack_ffffffffffffff10;
  string *in_stack_ffffffffffffff18;
  cppcms_capi_session *in_stack_ffffffffffffff20;
  allocator *paVar7;
  int local_a8;
  string local_a0 [39];
  allocator local_79;
  string local_78 [32];
  string *local_58;
  allocator local_49;
  string local_48 [48];
  char *local_18;
  long local_10;
  char *local_8;
  
  if (in_RDI == 0) {
    local_8 = (char *)0x0;
  }
  else {
    local_18 = in_RSI;
    local_10 = in_RDI;
    anon_unknown.dwarf_2860d0::check_str((char *)in_stack_ffffffffffffff20);
    cppcms_capi_session::check_loaded(in_stack_ffffffffffffff20);
    booster::hold_ptr<cppcms::session_interface>::operator->
              ((hold_ptr<cppcms::session_interface> *)(local_10 + 0x78));
    pcVar2 = local_18;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,pcVar2,&local_49);
    bVar3 = cppcms::session_interface::is_set
                      ((session_interface *)in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
    if (((bVar3 ^ 0xffU) & 1) == 0) {
      booster::hold_ptr<cppcms::session_interface>::operator*
                ((hold_ptr<cppcms::session_interface> *)(local_10 + 0x78));
      paVar7 = &local_79;
      std::allocator<char>::allocator();
      std::__cxx11::string::string(local_78,local_18,paVar7);
      psVar5 = cppcms::session_interface::operator[]
                         (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08);
      std::__cxx11::string::~string(local_78);
      std::allocator<char>::~allocator((allocator<char> *)&local_79);
      this = local_a0;
      local_58 = psVar5;
      std::__cxx11::string::string(this);
      iVar4 = std::__cxx11::string::size();
      std::__cxx11::string::reserve((ulong)this);
      for (local_a8 = 0; local_a8 < iVar4; local_a8 = local_a8 + 1) {
        pbVar6 = (byte *)std::__cxx11::string::operator[]((ulong)local_58);
        bVar1 = *pbVar6;
        std::__cxx11::string::operator+=
                  (local_a0,cppcms_capi_session_get_binary_as_hex::digits[bVar1 >> 4]);
        std::__cxx11::string::operator+=
                  (local_a0,cppcms_capi_session_get_binary_as_hex::digits[bVar1 & 0xf]);
      }
      std::__cxx11::string::swap((string *)(local_10 + 0xb8));
      local_8 = (char *)std::__cxx11::string::c_str();
      std::__cxx11::string::~string(local_a0);
    }
    else {
      local_8 = (char *)0x0;
    }
  }
  return local_8;
}

Assistant:

char const *cppcms_capi_session_get_binary_as_hex(cppcms_capi_session *session,char const *key)
{
	TRY {
		if(!session)
			return 0;
		check_str(key);
		session->check_loaded();

		if(!session->p->is_set(key))
			return 0;
		std::string const &value = (*(session->p))[key];
		std::string tmp;
		int len = value.size();
		tmp.reserve(len*2);
		for(int i=0;i<len;i++) {
			static char const *digits="0123456789abcdef";
			unsigned char c=value[i];
			tmp+=digits[(c >> 4u & 0xFu)];
			tmp+=digits[(c & 0xFu)];
		}
		session->returned_value.swap(tmp);
		return session->returned_value.c_str();
	}